

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexturefiledata.cpp
# Opt level: O3

void __thiscall QTextureFileData::setData(QTextureFileData *this,QImage *image,int level,int face)

{
  QTextureFileDataPrivate *pQVar1;
  pointer pQVar2;
  
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QTextureFileDataPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  QTextureFileDataPrivate::ensureSize(pQVar1,level + 1,face + 1,false);
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QTextureFileDataPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar2 = QList<QImage>::data((QList<QImage> *)
                               ((long)face * 0x18 +
                               (long)(pQVar1->images).super_QVLABase<QList<QImage>_>.
                                     super_QVLABaseBase.ptr));
  QImage::operator=(pQVar2 + level,image);
  return;
}

Assistant:

void QTextureFileData::setData(const QImage &image, int level, int face)
{
    Q_ASSERT(d->mode == ImageMode);
    d->ensureSize(level + 1, face + 1);
    d->images[face][level] = image;
}